

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.cc
# Opt level: O0

void __thiscall double_conversion::Bignum::Square(Bignum *this)

{
  Chunk CVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  Chunk *pCVar5;
  Bignum *in_RDI;
  Chunk chunk2_1;
  Chunk chunk1_1;
  int bigit_index2_1;
  int bigit_index1_1;
  int i_2;
  Chunk chunk2;
  Chunk chunk1;
  int bigit_index2;
  int bigit_index1;
  int i_1;
  int i;
  int copy_offset;
  DoubleChunk accumulator;
  int product_length;
  undefined4 in_stack_ffffffffffffffa0;
  uint in_stack_ffffffffffffffa4;
  int local_40;
  int local_3c;
  int local_38;
  int local_2c;
  int local_28;
  int local_24;
  int local_20;
  ulong local_18;
  
  iVar3 = (int)in_RDI->used_bigits_ << 1;
  EnsureCapacity(0);
  if (0xff < in_RDI->used_bigits_) {
    abort();
  }
  local_18 = 0;
  iVar4 = (int)in_RDI->used_bigits_;
  for (local_20 = 0; local_20 < in_RDI->used_bigits_; local_20 = local_20 + 1) {
    pCVar5 = RawBigit(in_RDI,local_20);
    CVar1 = *pCVar5;
    pCVar5 = RawBigit(in_RDI,iVar4 + local_20);
    *pCVar5 = CVar1;
  }
  for (local_24 = 0; local_24 < in_RDI->used_bigits_; local_24 = local_24 + 1) {
    local_2c = 0;
    for (local_28 = local_24; -1 < local_28; local_28 = local_28 + -1) {
      pCVar5 = RawBigit(in_RDI,iVar4 + local_28);
      uVar2 = *pCVar5;
      pCVar5 = RawBigit(in_RDI,iVar4 + local_2c);
      local_18 = (ulong)uVar2 * (ulong)*pCVar5 + local_18;
      local_2c = local_2c + 1;
    }
    pCVar5 = RawBigit(in_RDI,local_24);
    *pCVar5 = (uint)local_18 & 0xfffffff;
    local_18 = local_18 >> 0x1c;
  }
  for (local_38 = (int)in_RDI->used_bigits_; local_38 < iVar3; local_38 = local_38 + 1) {
    local_3c = in_RDI->used_bigits_ + -1;
    for (local_40 = local_38 - local_3c; local_40 < in_RDI->used_bigits_; local_40 = local_40 + 1) {
      pCVar5 = RawBigit(in_RDI,iVar4 + local_3c);
      uVar2 = *pCVar5;
      pCVar5 = RawBigit(in_RDI,iVar4 + local_40);
      local_18 = (ulong)uVar2 * (ulong)*pCVar5 + local_18;
      local_3c = local_3c + -1;
    }
    in_stack_ffffffffffffffa4 = (uint)local_18 & 0xfffffff;
    pCVar5 = RawBigit(in_RDI,local_38);
    *pCVar5 = in_stack_ffffffffffffffa4;
    local_18 = local_18 >> 0x1c;
  }
  in_RDI->used_bigits_ = (int16_t)iVar3;
  in_RDI->exponent_ = in_RDI->exponent_ << 1;
  Clamp((Bignum *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  return;
}

Assistant:

void Bignum::Square() {
  DOUBLE_CONVERSION_ASSERT(IsClamped());
  const int product_length = 2 * used_bigits_;
  EnsureCapacity(product_length);

  // Comba multiplication: compute each column separately.
  // Example: r = a2a1a0 * b2b1b0.
  //    r =  1    * a0b0 +
  //        10    * (a1b0 + a0b1) +
  //        100   * (a2b0 + a1b1 + a0b2) +
  //        1000  * (a2b1 + a1b2) +
  //        10000 * a2b2
  //
  // In the worst case we have to accumulate nb-digits products of digit*digit.
  //
  // Assert that the additional number of bits in a DoubleChunk are enough to
  // sum up used_digits of Bigit*Bigit.
  if ((1 << (2 * (kChunkSize - kBigitSize))) <= used_bigits_) {
    DOUBLE_CONVERSION_UNIMPLEMENTED();
  }
  DoubleChunk accumulator = 0;
  // First shift the digits so we don't overwrite them.
  const int copy_offset = used_bigits_;
  for (int i = 0; i < used_bigits_; ++i) {
    RawBigit(copy_offset + i) = RawBigit(i);
  }
  // We have two loops to avoid some 'if's in the loop.
  for (int i = 0; i < used_bigits_; ++i) {
    // Process temporary digit i with power i.
    // The sum of the two indices must be equal to i.
    int bigit_index1 = i;
    int bigit_index2 = 0;
    // Sum all of the sub-products.
    while (bigit_index1 >= 0) {
      const Chunk chunk1 = RawBigit(copy_offset + bigit_index1);
      const Chunk chunk2 = RawBigit(copy_offset + bigit_index2);
      accumulator += static_cast<DoubleChunk>(chunk1) * chunk2;
      bigit_index1--;
      bigit_index2++;
    }
    RawBigit(i) = static_cast<Chunk>(accumulator) & kBigitMask;
    accumulator >>= kBigitSize;
  }
  for (int i = used_bigits_; i < product_length; ++i) {
    int bigit_index1 = used_bigits_ - 1;
    int bigit_index2 = i - bigit_index1;
    // Invariant: sum of both indices is again equal to i.
    // Inner loop runs 0 times on last iteration, emptying accumulator.
    while (bigit_index2 < used_bigits_) {
      const Chunk chunk1 = RawBigit(copy_offset + bigit_index1);
      const Chunk chunk2 = RawBigit(copy_offset + bigit_index2);
      accumulator += static_cast<DoubleChunk>(chunk1) * chunk2;
      bigit_index1--;
      bigit_index2++;
    }
    // The overwritten RawBigit(i) will never be read in further loop iterations,
    // because bigit_index1 and bigit_index2 are always greater
    // than i - used_bigits_.
    RawBigit(i) = static_cast<Chunk>(accumulator) & kBigitMask;
    accumulator >>= kBigitSize;
  }
  // Since the result was guaranteed to lie inside the number the
  // accumulator must be 0 now.
  DOUBLE_CONVERSION_ASSERT(accumulator == 0);

  // Don't forget to update the used_digits and the exponent.
  used_bigits_ = static_cast<int16_t>(product_length);
  exponent_ *= 2;
  Clamp();
}